

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  int iVar1;
  ImDrawCmd *__src;
  unsigned_short *__src_00;
  ImDrawVert *__src_01;
  ImDrawList *this_00;
  ImDrawCmd *pIVar2;
  unsigned_short *puVar3;
  ImDrawVert *pIVar4;
  int iVar5;
  
  this_00 = (ImDrawList *)ImGui::MemAlloc(0xa8);
  ImDrawList(this_00,(ImDrawListSharedData *)0x0);
  pIVar2 = (this_00->CmdBuffer).Data;
  if (pIVar2 != (ImDrawCmd *)0x0) {
    (this_00->CmdBuffer).Size = 0;
    (this_00->CmdBuffer).Capacity = 0;
    ImGui::MemFree(pIVar2);
    (this_00->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  iVar1 = (this->CmdBuffer).Size;
  iVar5 = (this_00->CmdBuffer).Capacity;
  if (iVar5 < iVar1) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= iVar1) {
      iVar5 = iVar1;
    }
    pIVar2 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar5 * 0x30);
    __src = (this_00->CmdBuffer).Data;
    if (__src != (ImDrawCmd *)0x0) {
      memcpy(pIVar2,__src,(long)(this_00->CmdBuffer).Size * 0x30);
      ImGui::MemFree((this_00->CmdBuffer).Data);
    }
    (this_00->CmdBuffer).Data = pIVar2;
    (this_00->CmdBuffer).Capacity = iVar5;
  }
  else {
    pIVar2 = (ImDrawCmd *)0x0;
  }
  (this_00->CmdBuffer).Size = iVar1;
  memcpy(pIVar2,(this->CmdBuffer).Data,(long)iVar1 * 0x30);
  puVar3 = (this_00->IdxBuffer).Data;
  if (puVar3 != (unsigned_short *)0x0) {
    (this_00->IdxBuffer).Size = 0;
    (this_00->IdxBuffer).Capacity = 0;
    ImGui::MemFree(puVar3);
    (this_00->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  iVar1 = (this->IdxBuffer).Size;
  iVar5 = (this_00->IdxBuffer).Capacity;
  if (iVar5 < iVar1) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= iVar1) {
      iVar5 = iVar1;
    }
    puVar3 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
    __src_00 = (this_00->IdxBuffer).Data;
    if (__src_00 != (unsigned_short *)0x0) {
      memcpy(puVar3,__src_00,(long)(this_00->IdxBuffer).Size * 2);
      ImGui::MemFree((this_00->IdxBuffer).Data);
    }
    (this_00->IdxBuffer).Data = puVar3;
    (this_00->IdxBuffer).Capacity = iVar5;
  }
  else {
    puVar3 = (unsigned_short *)0x0;
  }
  (this_00->IdxBuffer).Size = iVar1;
  memcpy(puVar3,(this->IdxBuffer).Data,(long)iVar1 * 2);
  pIVar4 = (this_00->VtxBuffer).Data;
  if (pIVar4 != (ImDrawVert *)0x0) {
    (this_00->VtxBuffer).Size = 0;
    (this_00->VtxBuffer).Capacity = 0;
    ImGui::MemFree(pIVar4);
    (this_00->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  iVar1 = (this->VtxBuffer).Size;
  iVar5 = (this_00->VtxBuffer).Capacity;
  if (iVar5 < iVar1) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= iVar1) {
      iVar5 = iVar1;
    }
    pIVar4 = (ImDrawVert *)ImGui::MemAlloc((long)iVar5 * 0x14);
    __src_01 = (this_00->VtxBuffer).Data;
    if (__src_01 != (ImDrawVert *)0x0) {
      memcpy(pIVar4,__src_01,(long)(this_00->VtxBuffer).Size * 0x14);
      ImGui::MemFree((this_00->VtxBuffer).Data);
    }
    (this_00->VtxBuffer).Data = pIVar4;
    (this_00->VtxBuffer).Capacity = iVar5;
  }
  else {
    pIVar4 = (ImDrawVert *)0x0;
  }
  (this_00->VtxBuffer).Size = iVar1;
  memcpy(pIVar4,(this->VtxBuffer).Data,(long)iVar1 * 0x14);
  this_00->Flags = this->Flags;
  return this_00;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(NULL));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}